

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

size_t __thiscall c4::yml::Parser::LineContents::current_col(LineContents *this,csubstr s)

{
  char *pcVar1;
  code *pcVar2;
  bool bVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  
  pcVar6 = s.str;
  if (pcVar6 < (this->full).str) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      pcVar2 = (code *)swi(3);
      sVar4 = (*pcVar2)();
      return sVar4;
    }
    to_csubstr(
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              );
    (*(code *)PTR_error_impl_00234578)
              ("check failed: s.str >= full.str",0x1f,(anonymous_namespace)::s_default_callbacks);
  }
  sVar4 = (this->full).len;
  if (sVar4 == 0) {
    if ((s.len == 0) &&
       (pcVar1 = (this->full).str, pcVar5 = pcVar6, pcVar1 == pcVar6 && pcVar1 != (char *)0x0))
    goto LAB_001da900;
  }
  else {
    pcVar5 = (this->full).str;
    if (pcVar5 <= pcVar6 && pcVar6 + s.len <= pcVar5 + sVar4) goto LAB_001da900;
  }
  if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
    pcVar2 = (code *)swi(3);
    sVar4 = (*pcVar2)();
    return sVar4;
  }
  to_csubstr(
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            );
  (*(code *)PTR_error_impl_00234578)
            ("check failed: full.is_super(s)",0x1e,(anonymous_namespace)::s_default_callbacks);
  pcVar5 = (this->full).str;
LAB_001da900:
  return (long)pcVar6 - (long)pcVar5;
}

Assistant:

size_t current_col(csubstr s) const
        {
            RYML_ASSERT(s.str >= full.str);
            RYML_ASSERT(full.is_super(s));
            size_t col = static_cast<size_t>(s.str - full.str);
            return col;
        }